

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
           *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *pRVar1;
  Exception *pEVar2;
  ResponseHook *in_RDX;
  Exception *exception_1;
  Exception *exception;
  Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *value;
  undefined1 local_1c8 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_> result;
  WaitScope *waitScope_local;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_> *this_local
  ;
  
  result.value.ptr.field_1.value.hook.ptr = in_RDX;
  kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
  ::ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
                 *)local_1c8);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  kj::_::waitImpl(node,(ExceptionOrValue *)local_1c8,
                  (WaitScope *)result.value.ptr.field_1.value.hook.ptr);
  pRVar1 = kj::_::
           readMaybe<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>>
                     ((Maybe<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
                       *)((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pRVar1 != (Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)0x0) {
    pEVar2 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c8);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pRVar1 = mv<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>>
                       (pRVar1);
    pRVar1 = kj::_::
             returnMaybeVoid<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>>
                       (pRVar1);
    capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::Response
              ((Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)this,pRVar1)
    ;
    kj::_::
    ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::
    ~ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
                  *)local_1c8);
    return (__pid_t)this;
  }
  pEVar2 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c8);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }